

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O3

void __thiscall dlib::fatal_error::check_for_previous_fatal_errors(fatal_error *this)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if (!check_for_previous_fatal_errors::is_first_fatal_error) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "\n\n ************************** FATAL ERROR DETECTED ************************** "
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             " ************************** FATAL ERROR DETECTED ************************** "
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             " ************************** FATAL ERROR DETECTED ************************** \n"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Two fatal errors have been detected, the first was inappropriately ignored. \n"
                            );
    poVar3 = std::operator<<(poVar3,
                             "To prevent further fatal errors from being ignored this application will be \n"
                            );
    poVar3 = std::operator<<(poVar3,
                             "terminated immediately and you should go fix this buggy program.\n\n")
    ;
    poVar3 = std::operator<<(poVar3,"The error message from this fatal error was:\n");
    pcVar4 = (char *)(**(code **)(*(long *)&this->super_error + 0x10))(this);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n\n");
    std::endl<char,std::char_traits<char>>(poVar3);
    abort();
  }
  DAT_001fbb2f = 0;
  if ((this->super_error).info._M_string_length == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = 0;
    do {
      (&message()::buf)[uVar1] = (this->super_error).info._M_dataplus._M_p[uVar1];
      uVar2 = uVar1 + 1;
      if (0x7cd < uVar1) break;
      uVar1 = uVar2;
    } while (uVar2 < (this->super_error).info._M_string_length);
  }
  (&message()::buf)[uVar2] = 0;
  std::set_terminate(dlib_fatal_error_terminate);
  check_for_previous_fatal_errors::is_first_fatal_error = false;
  return;
}

Assistant:

void check_for_previous_fatal_errors()
        {
            // If dlib is being use to create plugins for some other application, like
            // MATLAB, then don't do these checks since it terminates the over arching
            // system.  Just let the errors go to the plugin handler and it will deal with
            // them.
#if defined(MATLAB_MEX_FILE) || defined(DLIB_NO_ABORT_ON_2ND_FATAL_ERROR)
            return;
#else
            static bool is_first_fatal_error = true;
            if (is_first_fatal_error == false)
            {
                std::cerr << "\n\n ************************** FATAL ERROR DETECTED ************************** " << std::endl;
                std::cerr << " ************************** FATAL ERROR DETECTED ************************** " << std::endl;
                std::cerr << " ************************** FATAL ERROR DETECTED ************************** \n" << std::endl;
                std::cerr << "Two fatal errors have been detected, the first was inappropriately ignored. \n"
                          << "To prevent further fatal errors from being ignored this application will be \n"
                          << "terminated immediately and you should go fix this buggy program.\n\n"
                          << "The error message from this fatal error was:\n" << this->what() << "\n\n" << std::endl;
                assert(false);
                abort();
            }
            else
            {
                // copy the message into the fixed message buffer so that it can be recalled by dlib_fatal_error_terminate
                // if needed.
                char* msg = message();
                unsigned long i;
                for (i = 0; i < 2000-1 && i < this->info.size(); ++i)
                    msg[i] = info[i];
                msg[i] = '\0';

                // set this termination handler so that if the user doesn't catch this dlib::fatal_error that is being
                // thrown then it will eventually be printed to standard error
                std::set_terminate(&dlib_fatal_error_terminate);
            }
            is_first_fatal_error = false;
#endif
        }